

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O0

void __thiscall
Filtration_simplex_iterator_test::test_method(Filtration_simplex_iterator_test *this)

{
  allocator<unsigned_int> *this_00;
  Filtration_value FVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<double> __l_00;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  Filtration_simplex_range *__x;
  reference puVar5;
  reference pvVar6;
  lazy_ostream *plVar7;
  reference pvVar8;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d8;
  assertion_result local_4b8;
  basic_cstring<const_char> local_4a0;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_460;
  assertion_result local_440;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_408;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_400;
  iterator it;
  size_t position;
  Filtration_simplex_range range;
  value_type_conflict2 local_3d0;
  value_type_conflict2 local_3c8;
  value_type_conflict2 local_3c0;
  value_type_conflict2 local_3b8;
  value_type_conflict2 local_3b0;
  value_type_conflict2 local_3a8;
  value_type_conflict2 local_3a0;
  value_type_conflict2 local_398;
  value_type_conflict2 local_390;
  value_type_conflict2 local_388;
  value_type_conflict2 local_380;
  value_type_conflict2 local_378;
  value_type_conflict2 local_370;
  value_type_conflict2 local_368;
  value_type_conflict2 local_360;
  value_type_conflict2 local_358;
  value_type_conflict2 local_350;
  value_type_conflict2 local_348;
  value_type_conflict2 local_340;
  value_type_conflict2 local_338;
  value_type_conflict2 local_330;
  value_type_conflict2 local_328;
  value_type_conflict2 local_320;
  value_type_conflict2 local_318;
  value_type_conflict2 local_310;
  value_type_conflict2 local_308;
  value_type_conflict2 local_300;
  value_type_conflict2 local_2f8;
  value_type_conflict2 local_2f0;
  value_type_conflict2 local_2e8;
  value_type_conflict2 local_2e0;
  value_type_conflict2 local_2d8;
  value_type_conflict2 local_2d0;
  value_type_conflict2 local_2c8;
  value_type_conflict2 local_2c0;
  value_type_conflict2 local_2b8;
  value_type_conflict2 local_2b0;
  value_type_conflict2 local_2a8;
  value_type_conflict2 local_2a0;
  value_type_conflict2 local_298;
  value_type_conflict2 local_290;
  value_type_conflict2 local_288;
  value_type_conflict2 local_280;
  value_type_conflict2 local_278;
  value_type_conflict2 local_270;
  value_type_conflict2 local_268;
  value_type_conflict2 local_260;
  value_type_conflict2 local_258;
  undefined1 local_250 [8];
  vector<double,_std::allocator<double>_> fil;
  value_type_conflict3 local_230;
  value_type_conflict3 local_22c;
  value_type_conflict3 local_228;
  value_type_conflict3 local_224;
  value_type_conflict3 local_220;
  value_type_conflict3 local_21c;
  value_type_conflict3 local_218;
  value_type_conflict3 local_214;
  value_type_conflict3 local_210;
  value_type_conflict3 local_20c;
  value_type_conflict3 local_208;
  value_type_conflict3 local_204;
  value_type_conflict3 local_200;
  value_type_conflict3 local_1fc;
  value_type_conflict3 local_1f8;
  value_type_conflict3 local_1f4;
  value_type_conflict3 local_1f0;
  value_type_conflict3 local_1ec;
  value_type_conflict3 local_1e8;
  value_type_conflict3 local_1e4;
  value_type_conflict3 local_1e0;
  value_type_conflict3 local_1dc;
  value_type_conflict3 local_1d8;
  value_type_conflict3 local_1d4;
  value_type_conflict3 local_1d0;
  value_type_conflict3 local_1cc;
  value_type_conflict3 local_1c8;
  value_type_conflict3 local_1c4;
  value_type_conflict3 local_1c0;
  value_type_conflict3 local_1bc;
  value_type_conflict3 local_1b8;
  value_type_conflict3 local_1b4;
  value_type_conflict3 local_1b0;
  value_type_conflict3 local_1ac;
  value_type_conflict3 local_1a8;
  value_type_conflict3 local_1a4;
  value_type_conflict3 local_1a0;
  value_type_conflict3 local_19c;
  value_type_conflict3 local_198;
  value_type_conflict3 local_194;
  value_type_conflict3 local_190;
  value_type_conflict3 local_18c;
  value_type_conflict3 local_188;
  value_type_conflict3 local_184;
  value_type_conflict3 local_180;
  value_type_conflict3 local_17c;
  value_type_conflict3 local_178;
  value_type_conflict3 local_174;
  undefined1 local_170 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dim;
  Bitmap_cubical_complex increasing;
  uint local_d0 [2];
  iterator local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  allocator<double> local_89;
  double local_88 [10];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  Filtration_simplex_iterator_test *this_local;
  
  local_88[8] = 9.0;
  local_88[6] = 7.0;
  local_88[7] = 8.0;
  local_88[4] = 5.0;
  local_88[5] = 6.0;
  local_88[2] = 3.0;
  local_88[3] = 4.0;
  local_88[0] = 1.0;
  local_88[1] = 2.0;
  local_38 = local_88;
  local_30 = 9;
  increasingFiltrationOfTopDimensionalCells.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<double>::allocator(&local_89);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_00,&local_89);
  std::allocator<double>::~allocator(&local_89);
  local_d0[0] = 3;
  local_d0[1] = 3;
  local_c8 = local_d0;
  local_c0 = 2;
  this_00 = (allocator<unsigned_int> *)
            ((long)&increasing.sorted_cells.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = local_c0;
  __l._M_array = local_c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&increasing.sorted_cells.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )&dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,
             (vector<double,_std::allocator<double>_> *)local_28,true);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170);
  local_174 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe8c);
  local_178 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe88);
  local_17c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe84);
  local_180 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe80);
  local_184 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe7c);
  local_188 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe78);
  local_18c = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe74);
  local_190 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe70);
  local_194 = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe6c);
  local_198 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe68);
  local_19c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe64);
  local_1a0 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe60);
  local_1a4 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe5c);
  local_1a8 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe58);
  local_1ac = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe54);
  local_1b0 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe50);
  local_1b4 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe4c);
  local_1b8 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe48);
  local_1bc = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe44);
  local_1c0 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe40);
  local_1c4 = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe3c);
  local_1c8 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe38);
  local_1cc = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe34);
  local_1d0 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe30);
  local_1d4 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe2c);
  local_1d8 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe28);
  local_1dc = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe24);
  local_1e0 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe20);
  local_1e4 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe1c);
  local_1e8 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe18);
  local_1ec = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe14);
  local_1f0 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe10);
  local_1f4 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe0c);
  local_1f8 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe08);
  local_1fc = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe04);
  local_200 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffe00);
  local_204 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdfc);
  local_208 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdf8);
  local_20c = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdf4);
  local_210 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdf0);
  local_214 = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdec);
  local_218 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffde8);
  local_21c = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffde4);
  local_220 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffde0);
  local_224 = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffddc);
  local_228 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdd8);
  local_22c = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdd4);
  local_230 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             &stack0xfffffffffffffdd0);
  fil.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
             (value_type_conflict3 *)
             ((long)&fil.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_250);
  local_258 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_258);
  local_260 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_260);
  local_268 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_268);
  local_270 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_270);
  local_278 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_278);
  local_280 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_280);
  local_288 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_288);
  local_290 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_290);
  local_298 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_298);
  local_2a0 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2a0);
  local_2a8 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2a8);
  local_2b0 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2b0);
  local_2b8 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2b8);
  local_2c0 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2c0);
  local_2c8 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2c8);
  local_2d0 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2d0);
  local_2d8 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2d8);
  local_2e0 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2e0);
  local_2e8 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2e8);
  local_2f0 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2f0);
  local_2f8 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_2f8);
  local_300 = 4.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_300);
  local_308 = 4.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_308);
  local_310 = 4.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_310);
  local_318 = 4.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_318);
  local_320 = 4.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_320);
  local_328 = 4.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_328);
  local_330 = 5.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_330);
  local_338 = 5.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_338);
  local_340 = 5.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_340);
  local_348 = 5.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_348);
  local_350 = 6.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_350);
  local_358 = 6.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_358);
  local_360 = 6.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_360);
  local_368 = 6.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_368);
  local_370 = 7.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_370);
  local_378 = 7.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_378);
  local_380 = 7.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_380);
  local_388 = 7.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_388);
  local_390 = 7.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_390);
  local_398 = 7.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_398);
  local_3a0 = 8.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3a0);
  local_3a8 = 8.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3a8);
  local_3b0 = 8.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3b0);
  local_3b8 = 8.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3b8);
  local_3c0 = 9.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3c0);
  local_3c8 = 9.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3c8);
  local_3d0 = 9.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,&local_3d0);
  range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4022000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_250,
             (value_type_conflict2 *)
             &range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = Gudhi::cubical_complex::
        Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
        filtration_simplex_range
                  ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                    *)&dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&position,__x);
  it._M_current = (unsigned_long *)0x0;
  local_400._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&position);
  while( true ) {
    local_408._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&position);
    bVar3 = __gnu_cxx::operator!=(&local_400,&local_408);
    if (!bVar3) break;
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_418,0x1ac,&local_428);
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_400);
      uVar4 = Gudhi::cubical_complex::
              Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
              dimension((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                         *)&dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,*puVar5);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,
                          (size_type)it._M_current);
      boost::test_tools::assertion_result::assertion_result(&local_440,uVar4 == *pvVar6);
      plVar7 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_470,"increasing.dimension(*it) == dim[position]",0x2a);
      boost::unit_test::operator<<(&local_460,plVar7,&local_470);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_480,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::test_tools::tt_detail::report_assertion(&local_440,&local_460,&local_480,0x1ac,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_460);
      boost::test_tools::assertion_result::~assertion_result(&local_440);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_490,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_490,0x1ad,&local_4a0);
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_400);
      FVar1 = Gudhi::cubical_complex::
              Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
              filtration((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                          *)&dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,*puVar5);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_250,
                          (size_type)it._M_current);
      boost::test_tools::assertion_result::assertion_result
                (&local_4b8,(bool)(-(FVar1 == *pvVar8) & 1));
      plVar7 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_4e8,"increasing.filtration(*it) == fil[position]",0x2b);
      boost::unit_test::operator<<(&local_4d8,plVar7,&local_4e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_4f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::test_tools::tt_detail::report_assertion(&local_4b8,&local_4d8,&local_4f8,0x1ad,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_4d8);
      boost::test_tools::assertion_result::~assertion_result(&local_4b8);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    it._M_current = it._M_current + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_400);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&position);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_250);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )&dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Filtration_simplex_iterator_test) {
  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);

  std::vector<unsigned> dim;
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);

  std::vector<double> fil;
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(5);
  fil.push_back(5);
  fil.push_back(5);
  fil.push_back(5);
  fil.push_back(6);
  fil.push_back(6);
  fil.push_back(6);
  fil.push_back(6);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(8);
  fil.push_back(8);
  fil.push_back(8);
  fil.push_back(8);
  fil.push_back(9);
  fil.push_back(9);
  fil.push_back(9);
  fil.push_back(9);

  Bitmap_cubical_complex::Filtration_simplex_range range = increasing.filtration_simplex_range();
  size_t position = 0;
  for (auto it = range.begin(); it != range.end(); ++it) {
    BOOST_CHECK(increasing.dimension(*it) == dim[position]);
    BOOST_CHECK(increasing.filtration(*it) == fil[position]);
    ++position;
  }
}